

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O3

int Disasm(PDISASM pMyDisasm)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  
  InitVariables(pMyDisasm);
  pbVar3 = (byte *)(pMyDisasm->Reserved_).EIP_;
  pbVar4 = (byte *)(pMyDisasm->Reserved_).EndOfBlock;
  if (pbVar4 < pbVar3 + 1 && pbVar4 != (byte *)0x0) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  else {
    (pMyDisasm->Instruction).Opcode = (uint)*pbVar3;
    (*opcode_map1[*pbVar3])(pMyDisasm);
    iVar1 = (pMyDisasm->Reserved_).ERROR_OPCODE;
    iVar2 = (pMyDisasm->Reserved_).OutOfBlock;
    pMyDisasm->Error = iVar1;
    if (iVar2 == 0) {
      if (iVar1 != -1) {
        FixOpSizeForMemoryOperand(pMyDisasm);
        UVar5 = (pMyDisasm->Reserved_).REX.R_;
        UVar6 = (pMyDisasm->Reserved_).REX.X_;
        UVar7 = (pMyDisasm->Reserved_).REX.B_;
        (pMyDisasm->Prefix).REX.W_ = (pMyDisasm->Reserved_).REX.W_;
        (pMyDisasm->Prefix).REX.R_ = UVar5;
        (pMyDisasm->Prefix).REX.X_ = UVar6;
        (pMyDisasm->Prefix).REX.B_ = UVar7;
        (pMyDisasm->Prefix).REX.state = (pMyDisasm->Reserved_).REX.state;
        FillSegmentsRegisters(pMyDisasm);
        if ((pMyDisasm->Instruction).BranchType - 0xbU < 2) {
          (pMyDisasm->Operand1).AccessMode = 1;
        }
        if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        BuildCompleteInstruction(pMyDisasm);
        return (int)(pMyDisasm->Reserved_).EIP_ - (int)pMyDisasm->EIP;
      }
      BuildCompleteInstruction(pMyDisasm);
      return -1;
    }
  }
  pMyDisasm->Error = -2;
  return -2;
}

Assistant:

int __bea_callspec__ Disasm (PDISASM pMyDisasm)
{
  if (InitVariables(pMyDisasm)) {
    (void) AnalyzeOpcode(pMyDisasm);
    pMyDisasm->Error = GV.ERROR_OPCODE;
    if (!GV.OutOfBlock) {
      if (GV.ERROR_OPCODE == UNKNOWN_OPCODE) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return UNKNOWN_OPCODE;
      }
      else {
        FixOpSizeForMemoryOperand(pMyDisasm);
        FixREXPrefixes(pMyDisasm);
        FillSegmentsRegisters(pMyDisasm);
        CompleteInstructionFields(pMyDisasm);
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return (int) (GV.EIP_-pMyDisasm->EIP);
      }
    }
    else {
      pMyDisasm->Error = OUT_OF_BLOCK;
      return OUT_OF_BLOCK;
    }
  }
  else {
    return UNKNOWN_OPCODE;
  }
}